

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-chunk.c
# Opt level: O3

_Bool chunk_copy(chunk_conflict *dest,player *p,chunk_conflict *source,wchar_t y0,wchar_t x0,
                wchar_t rotate,_Bool reflect)

{
  monster_group_info *pmVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  bitflag *flags1;
  monster_race *pmVar7;
  monster_group *pmVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  _Bool _Var12;
  int16_t iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  square *psVar17;
  object *poVar18;
  trap *ptVar19;
  object **ppoVar20;
  int iVar21;
  uint uVar22;
  uint32_t uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  wchar_t wVar27;
  loc grid;
  monster *__src;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  mon_group_list_entry *pmVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  long lVar36;
  ulong uVar37;
  int iVar38;
  loc grid_00;
  monster *pmVar39;
  ghost_info preserved_ghost;
  wchar_t local_140;
  ulong local_138;
  undefined1 local_e0 [176];
  ulong uVar35;
  
  uVar22 = source->height;
  uVar32 = (ulong)uVar22;
  if (uVar22 + y0 <= dest->height) {
    uVar6 = source->width;
    uVar30 = (ulong)uVar6;
    if (uVar6 + x0 <= dest->width) {
      uVar4 = dest->mon_max;
      uVar15 = (ulong)uVar4;
      if (0 < (int)uVar22) {
        wVar27 = rotate + L'\x03';
        if (L'\xffffffff' < rotate) {
          wVar27 = rotate;
        }
        iVar38 = rotate - (wVar27 & 0xfffffffcU);
        local_138 = 0;
        do {
          if (0 < (int)uVar6) {
            uVar37 = 0;
            do {
              if (iVar38 < 1) {
                iVar21 = (int)local_138;
                uVar14 = (uint)uVar37;
                uVar22 = uVar6;
              }
              else {
                uVar35 = uVar37 & 0xffffffff;
                uVar33 = uVar30;
                uVar29 = local_138 & 0xffffffff;
                iVar24 = iVar38;
                uVar11 = uVar32;
                do {
                  uVar28 = uVar33;
                  uVar16 = uVar35;
                  uVar22 = (uint)uVar11;
                  uVar14 = ~(uint)uVar29 + uVar22;
                  iVar21 = (int)uVar16;
                  iVar24 = iVar24 + -1;
                  uVar35 = (ulong)uVar14;
                  uVar33 = uVar11;
                  uVar29 = uVar16;
                  uVar11 = uVar28;
                } while (iVar24 != 0);
              }
              uVar22 = ~uVar14 + uVar22;
              if (!reflect) {
                uVar22 = uVar14;
              }
              wVar27 = iVar21 + y0;
              grid_00.x = uVar22 + x0;
              grid = (loc)(local_138 << 0x20 | uVar37);
              psVar17 = square(source,grid);
              dest->squares[wVar27][grid_00.x].feat = psVar17->feat;
              grid_00.y = wVar27;
              psVar17 = square(dest,grid_00);
              flags1 = psVar17->info;
              psVar17 = square(source,grid);
              flag_copy(flags1,psVar17->info,3);
              poVar18 = square_object(source,grid);
              if (poVar18 != (object *)0x0) {
                poVar18 = square_object(source,grid);
                dest->squares[wVar27][grid_00.x].obj = poVar18;
                for (poVar18 = square_object(source,grid); poVar18 != (object *)0x0;
                    poVar18 = poVar18->next) {
                  poVar18->grid = grid_00;
                }
                source->squares[local_138][uVar37].obj = (object *)0x0;
              }
              psVar17 = square(source,grid);
              if (psVar17->trap != (trap *)0x0) {
                psVar17 = square(source,grid);
                ptVar19 = psVar17->trap;
                dest->squares[wVar27][grid_00.x].trap = ptVar19;
                for (; ptVar19 != (trap *)0x0; ptVar19 = ptVar19->next) {
                  ptVar19->grid = grid_00;
                }
                source->squares[local_138][uVar37].trap = (trap *)0x0;
              }
              psVar17 = square(source,grid);
              if (psVar17->mon == -1) {
                dest->squares[wVar27][grid_00.x].mon = -1;
                (p->grid).x = grid_00.x;
                (p->grid).y = wVar27;
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != uVar30);
          }
          local_138 = local_138 + 1;
        } while (local_138 != uVar32);
        uVar4 = dest->mon_max;
      }
      uVar2 = source->mon_max;
      uVar3 = source->mon_cnt;
      dest->mon_max = uVar4 + uVar2;
      dest->mon_cnt = dest->mon_cnt + uVar3;
      dest->num_repro = dest->num_repro + source->num_repro;
      local_140 = L'\xffffffff';
      iVar38 = (int)(uVar15 - 1);
      if (1 < source->mon_max) {
        wVar27 = rotate + L'\x03';
        if (L'\xffffffff' < rotate) {
          wVar27 = rotate;
        }
        iVar21 = rotate - (wVar27 & 0xfffffffcU);
        local_140 = L'\xffffffff';
        uVar37 = 1;
        do {
          pmVar7 = source->monsters[uVar37].race;
          if (pmVar7 != (monster_race *)0x0) {
            __src = source->monsters + uVar37;
            pmVar39 = dest->monsters;
            _Var12 = flag_has_dbg(pmVar7->flags,0xc,2,"source_mon->race->flags","RF_PLAYER_GHOST");
            if (_Var12) {
              if (dest->ghost->bones_selector == L'\0') {
                mem_free(dest->ghost);
                dest->ghost = source->ghost;
                source->ghost = (ghost_info *)0x0;
              }
              else {
                if (local_140 != L'\xffffffff') {
                  __assert_fail("skipped_ghost_id == -1",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                                ,0x1bb,
                                "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                               );
                }
                local_140 = __src->midx + iVar38;
              }
            }
            pmVar39 = pmVar39 + uVar37 + (uVar15 - 1);
            memcpy(pmVar39,__src,0x1f0);
            wVar27 = pmVar39->midx + iVar38;
            pmVar39->midx = wVar27;
            uVar22 = (pmVar39->grid).x;
            uVar14 = (pmVar39->grid).y;
            uVar11 = uVar30;
            uVar35 = uVar32;
            uVar34 = uVar6;
            uVar25 = uVar14;
            iVar24 = iVar21;
            if (0 < iVar21) {
              do {
                uVar25 = uVar22;
                uVar33 = uVar11;
                uVar34 = (uint)uVar35;
                uVar22 = ~uVar14 + uVar34;
                iVar24 = iVar24 + -1;
                uVar11 = uVar35;
                uVar35 = uVar33;
                uVar14 = uVar25;
              } while (iVar24 != 0);
            }
            uVar14 = ~uVar22 + uVar34;
            if (!reflect) {
              uVar14 = uVar22;
            }
            (pmVar39->grid).y = uVar25 + y0;
            (pmVar39->grid).x = uVar14 + x0;
            iVar13 = (int16_t)wVar27;
            dest->squares[uVar25 + y0][uVar14 + x0].mon = iVar13;
            if (__src->held_obj != (object *)0x0) {
              pmVar39->held_obj = __src->held_obj;
              for (poVar18 = __src->held_obj; poVar18 != (object *)0x0; poVar18 = poVar18->next) {
                poVar18->held_m_idx = iVar13;
              }
              __src->held_obj = (object *)0x0;
            }
            poVar18 = __src->mimicked_obj;
            if (poVar18 != (object *)0x0) {
              pmVar39->mimicked_obj = poVar18;
              poVar18->mimicking_m_idx = iVar13;
              __src->mimicked_obj = (object *)0x0;
            }
          }
          uVar37 = uVar37 + 1;
        } while (uVar37 < source->mon_max);
      }
      uVar4 = z_info->level_monster_max;
      iVar21 = 0;
      if (1 < uVar4) {
        uVar32 = 0;
        uVar30 = 1;
        do {
          if (dest->monster_groups[uVar30] != (monster_group *)0x0) {
            uVar32 = uVar30 & 0xffffffff;
          }
          iVar21 = (int)uVar32;
          uVar30 = uVar30 + 1;
        } while ((uint)uVar4 != uVar30);
      }
      if (1 < (int)((uint)uVar4 - iVar21)) {
        lVar26 = 1;
        do {
          pmVar8 = source->monster_groups[lVar26];
          dest->monster_groups[lVar26 + iVar21] = pmVar8;
          if (pmVar8 != (monster_group *)0x0) {
            pmVar31 = pmVar8->member_list;
            pmVar8->index = pmVar8->index + iVar21;
            pmVar8->leader = pmVar8->leader + iVar38;
            if (pmVar31 != (mon_group_list_entry *)0x0) {
              pmVar39 = dest->monsters;
              do {
                lVar36 = (long)pmVar31->midx + (long)iVar38;
                wVar27 = pmVar39[lVar36].midx;
                pmVar31->midx = wVar27;
                if (wVar27 != (wchar_t)lVar36) {
                  __assert_fail("entry->midx == mon_skip + idx",
                                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                                ,0x1f6,
                                "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                               );
                }
                pmVar1 = pmVar39[lVar36].group_info;
                pmVar1->index = pmVar1->index + iVar21;
                pmVar31 = pmVar31->next;
              } while (pmVar31 != (mon_group_list_entry *)0x0);
            }
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < (long)((ulong)z_info->level_monster_max - (long)iVar21));
      }
      monster_groups_verify(dest);
      ppoVar20 = (object **)
                 mem_realloc(dest->objects,
                             (ulong)((uint)source->obj_max + (uint)dest->obj_max) * 8 + 0x10);
      dest->objects = ppoVar20;
      uVar4 = source->obj_max;
      uVar5 = dest->obj_max;
      uVar32 = (ulong)uVar5;
      lVar26 = (ulong)uVar4 + 1;
      lVar36 = 0;
      do {
        dest->objects[uVar32] = *(object **)((long)source->objects + lVar36);
        if (dest->objects[uVar32] != (object *)0x0) {
          dest->objects[uVar32]->oidx = (uint16_t)uVar32;
        }
        *(undefined8 *)((long)source->objects + lVar36) = 0;
        uVar32 = uVar32 + 1;
        lVar36 = lVar36 + 8;
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
      dest->obj_max = uVar4 + uVar5 + 1;
      source->obj_max = 1;
      lVar26 = 0;
      object_lists_check_integrity(dest,(chunk_conflict *)0x0);
      uVar4 = z_info->f_max;
      piVar9 = source->feat_count;
      piVar10 = dest->feat_count;
      do {
        piVar10[lVar26] = piVar10[lVar26] + piVar9[lVar26];
        lVar26 = lVar26 + 1;
      } while ((ulong)uVar4 + 1 != lVar26);
      uVar23 = 0xffffffff;
      if (!CARRY4(source->obj_rating,dest->obj_rating)) {
        uVar23 = source->obj_rating + dest->obj_rating;
      }
      dest->obj_rating = uVar23;
      add_to_monster_rating((chunk *)dest,source->mon_rating);
      if (source->good_item == true) {
        dest->good_item = true;
      }
      if (local_140 == L'\xffffffff') {
        return true;
      }
      memcpy(local_e0,dest->ghost,0xb0);
      delete_monster_idx((chunk *)dest,local_140);
      memcpy(dest->ghost,local_e0,0xb0);
      uVar22 = dest->mon_rating;
      if (uVar22 == 0xffffffff) {
        return true;
      }
      if (9 < uVar22) {
        dest->mon_rating = uVar22 - 10;
        return true;
      }
      __assert_fail("dest->mon_rating >= 10",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-chunk.c"
                    ,0x229,
                    "_Bool chunk_copy(struct chunk *, struct player *, struct chunk *, int, int, int, _Bool)"
                   );
    }
  }
  return false;
}

Assistant:

bool chunk_copy(struct chunk *dest, struct player *p, struct chunk *source,
		int y0, int x0, int rotate, bool reflect)
{
	int i, max_group_id = 0;
	struct loc grid;
	int h = source->height, w = source->width;
	int mon_skip = dest->mon_max - 1;
	int skipped_ghost_id = -1;

	/* Check bounds */
	if (rotate % 1) {
		if ((w + y0 > dest->height) || (h + x0 > dest->width))
			return false;
	} else {
		if ((h + y0 > dest->height) || (w + x0 > dest->width))
			return false;
	}

	/* Write the location stuff (terrain, objects, traps) */
	for (grid.y = 0; grid.y < h; grid.y++) {
		for (grid.x = 0; grid.x < w; grid.x++) {
			/* Work out where we're going */
			struct loc dest_grid = grid;
			symmetry_transform(&dest_grid, y0, x0, h, w, rotate, reflect);

			/* Terrain */
			dest->squares[dest_grid.y][dest_grid.x].feat =
				square(source, grid)->feat;
			sqinfo_copy(square(dest, dest_grid)->info,
						square(source, grid)->info);

			/* Dungeon objects */
			if (square_object(source, grid)) {
				struct object *obj;
				dest->squares[dest_grid.y][dest_grid.x].obj =
					square_object(source, grid);

				for (obj = square_object(source, grid); obj; obj = obj->next) {
					/* Adjust position */
					obj->grid = dest_grid;
				}
				source->squares[grid.y][grid.x].obj = NULL;
			}

			/* Traps */
			if (square(source, grid)->trap) {
				struct trap *trap = square(source, grid)->trap;
				dest->squares[dest_grid.y][dest_grid.x].trap = trap;

				/* Traverse the trap list */
				while (trap) {
					/* Adjust location */
					trap->grid = dest_grid;
					trap = trap->next;
				}
				source->squares[grid.y][grid.x].trap = NULL;
			}

			/* Player */
			if (square(source, grid)->mon == -1) {
				dest->squares[dest_grid.y][dest_grid.x].mon = -1;
				p->grid = dest_grid;
			}
		}
	}

	/* Monsters */
	dest->mon_max += source->mon_max;
	dest->mon_cnt += source->mon_cnt;
	dest->num_repro += source->num_repro;
	for (i = 1; i < source->mon_max; i++) {
		struct monster *source_mon = &source->monsters[i];
		struct monster *dest_mon = &dest->monsters[mon_skip + i];

		/* Valid monster */
		if (!source_mon->race) continue;

		/* Deal with player ghosts */
		if (source_mon->race &&
			rf_has(source_mon->race->flags, RF_PLAYER_GHOST)) {
			/*
			 * Only allow one ghost, preferring the ghost from
			 * the destination if both chunks have a ghost.
			 * Remember a ghost from the source that was not
			 * put in dest->ghost so it can be deleted once the
			 * monsters and monster groups are copied.
			 */
			if (dest->ghost->bones_selector) {
				/* source should not have multiple ghosts. */
				assert(skipped_ghost_id == -1);
				skipped_ghost_id = source_mon->midx + mon_skip;
			} else {
				/* Shift the ghost */
				mem_free(dest->ghost);
				dest->ghost = source->ghost;
				source->ghost = NULL;
			}
		}

		/* Copy */
		memcpy(dest_mon, source_mon, sizeof(struct monster));

		/* Adjust monster index */
		dest_mon->midx += mon_skip;

		/* Move grid */
		symmetry_transform(&dest_mon->grid, y0, x0, h, w, rotate, reflect);
		dest->squares[dest_mon->grid.y][dest_mon->grid.x].mon = dest_mon->midx;

		/* Held or mimicked objects */
		if (source_mon->held_obj) {
			struct object *obj;
			dest_mon->held_obj = source_mon->held_obj;
			for (obj = source_mon->held_obj; obj; obj = obj->next) {
				obj->held_m_idx = dest_mon->midx;
			}
			source_mon->held_obj = NULL;
		}
		if (source_mon->mimicked_obj) {
			dest_mon->mimicked_obj = source_mon->mimicked_obj;
			dest_mon->mimicked_obj->mimicking_m_idx =
				dest_mon->midx;
			source_mon->mimicked_obj = NULL;
		}
	}

	/* Find max monster group id */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (dest->monster_groups[i]) max_group_id = i;
	}

	/* Copy monster groups */
	for (i = 1; i < z_info->level_monster_max - max_group_id; i++) {
		struct monster_group *group = source->monster_groups[i];
		struct mon_group_list_entry *entry;

		/* Copy monster group list */
		dest->monster_groups[i + max_group_id] = source->monster_groups[i];

		/* Adjust monster group indices */
		if (!group) continue;
		entry = group->member_list;
		group->index += max_group_id;
		group->leader += mon_skip;
		while (entry) {
			int idx = entry->midx;
			struct monster *mon = &dest->monsters[mon_skip + idx];
			entry->midx = mon->midx;
			assert(entry->midx == mon_skip + idx);
			mon->group_info[0].index += max_group_id;
			entry = entry->next;
		}
	}
	monster_groups_verify(dest);

	/* Copy object list */
	dest->objects = mem_realloc(dest->objects,
								(dest->obj_max + source->obj_max + 2)
								* sizeof(struct object*));
	for (i = 0; i <= source->obj_max; i++) {
		dest->objects[dest->obj_max + i] = source->objects[i];
		if (dest->objects[dest->obj_max + i] != NULL)
			dest->objects[dest->obj_max + i]->oidx = dest->obj_max + i;
		source->objects[i] = NULL;
	}
	dest->obj_max += source->obj_max + 1;
	source->obj_max = 1;
	object_lists_check_integrity(dest, NULL);

	/* Miscellany */
	for (i = 0; i < z_info->f_max + 1; i++)
		dest->feat_count[i] += source->feat_count[i];

	if (dest->obj_rating < UINT32_MAX - source->obj_rating) {
		dest->obj_rating += source->obj_rating;
	} else {
		dest->obj_rating = UINT32_MAX;
	}
	add_to_monster_rating(dest, source->mon_rating);

	if (source->good_item)
		dest->good_item = true;

	if (skipped_ghost_id != -1) {
		/*
		 * dest->ghost does not refer to the ghost at skipped_ghost_id
		 * so remember it and restore it after delete_monster_idx()
		 * does its work.
		 */
		struct ghost_info preserved_ghost = *dest->ghost;

		delete_monster_idx(dest, skipped_ghost_id);
		*dest->ghost = preserved_ghost;
		/*
		 * Compensate for the change to monster rating, but do
		 * nothing if it saturated:  do not know what to subtract
		 * in that case.
		 */
		if (dest->mon_rating != UINT32_MAX) {
			assert(dest->mon_rating >= 10);
			dest->mon_rating -= 10;
		}
	}

	return true;
}